

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ShaderTextureImageSampleFunctionalTest::iterate(ShaderTextureImageSampleFunctionalTest *this)

{
  uint n_sampler_type;
  _sampler_type _Var1;
  uint n_test_type;
  _test_type _Var2;
  _test_type test_type;
  _sampler_type sampler_type;
  _test_type local_30;
  _sampler_type local_2c;
  
  for (_Var1 = SAMPLER_TYPE_ISAMPLER2DMS; _Var1 != SAMPLER_TYPE_COUNT;
      _Var1 = _Var1 + SAMPLER_TYPE_ISAMPLER2DMSARRAY) {
    local_2c = _Var1;
    for (_Var2 = TEST_TYPE_IMAGE; _Var2 != TEST_TYPE_COUNT; _Var2 = _Var2 + TEST_TYPE_TEXTURE) {
      local_30 = _Var2;
      if (_Var2 == *(_test_type *)&(this->super_ShaderTextureImageSamplesTestBase).field_0xa4) {
        ShaderTextureImageSamplesTestBase::executeFunctionalTest
                  (&this->super_ShaderTextureImageSamplesTestBase,&local_2c,&local_30);
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderTextureImageSamplesTestBase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ShaderTextureImageSampleFunctionalTest::iterate()
{
	for (unsigned int n_sampler_type = 0; n_sampler_type < SAMPLER_TYPE_COUNT; ++n_sampler_type)
	{
		_sampler_type sampler_type = (_sampler_type)n_sampler_type;

		for (unsigned int n_test_type = 0; n_test_type < TEST_TYPE_COUNT; ++n_test_type)
		{
			_test_type test_type = (_test_type)n_test_type;

			if (test_type == type_to_test)
			{
				executeFunctionalTest(sampler_type, test_type);
			}
		} /* for (all test types) */
	}	 /* for (all sampler types) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}